

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_scaling_operations.c
# Opt level: O2

void WebRtcSpl_VectorBitShiftW16(int16_t *res,size_t length,int16_t *in,int16_t right_shifts)

{
  size_t sVar1;
  
  if (right_shifts < 1) {
    for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
      res[sVar1] = in[sVar1] << (-(byte)right_shifts & 0x1f);
    }
  }
  else {
    for (sVar1 = 0; length != sVar1; sVar1 = sVar1 + 1) {
      res[sVar1] = (int16_t)((int)in[sVar1] >> ((byte)right_shifts & 0x1f));
    }
  }
  return;
}

Assistant:

void WebRtcSpl_VectorBitShiftW16(int16_t *res, size_t length,
                                 const int16_t *in, int16_t right_shifts)
{
    size_t i;

    if (right_shifts > 0)
    {
        for (i = length; i > 0; i--)
        {
            (*res++) = ((*in++) >> right_shifts);
        }
    } else
    {
        for (i = length; i > 0; i--)
        {
            (*res++) = ((*in++) << (-right_shifts));
        }
    }
}